

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void cfd::core::ConfidentialNonce::CheckVersion(uint8_t version)

{
  CfdException *this;
  allocator local_49;
  string local_48;
  CfdSourceLocation local_28;
  uint8_t local_9 [8];
  uint8_t version_local;
  
  if ((((version != '\0') && (version != '\x01')) && (version != '\x02')) && (version != '\x03')) {
    local_9[0] = version;
    local_28.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_28.filename = local_28.filename + 1;
    local_28.line = 0x145;
    local_28.funcname = "CheckVersion";
    logger::warn<unsigned_char&>(&local_28,"Nonce version Invalid. version={}.",local_9);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_48,"Nonce version Invalid.",&local_49);
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_48);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void ConfidentialNonce::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 2) && (version != 3)) {
    warn(CFD_LOG_SOURCE, "Nonce version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Nonce version Invalid.");
  }
}